

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort.cpp
# Opt level: O1

void burstsort_vector_block(uchar **strings,size_t n)

{
  _WordT *p_Var1;
  byte bVar2;
  ulong uVar3;
  TrieNode<unsigned_char> *pTVar4;
  vector_block<unsigned_char_*,_1024U> *pvVar5;
  TrieNode<unsigned_char> *pTVar6;
  _func_void_uchar_ptr_ptr_int_int *in_RCX;
  size_t depth;
  size_t sVar7;
  _func_void_uchar_ptr_ptr_int_int *p_Var8;
  ulong uVar9;
  uchar *str;
  BurstSimple<unsigned_char> local_61;
  uchar **local_60;
  TrieNode<unsigned_char> *local_58;
  size_t local_50;
  vector_block<unsigned_char_*,_1024U> *local_48;
  size_t local_40;
  byte *local_38;
  
  local_60 = strings;
  pTVar4 = (TrieNode<unsigned_char> *)operator_new(0x820);
  memset(pTVar4,0,0x820);
  local_50 = n;
  if (n != 0) {
    sVar7 = 0;
    local_58 = pTVar4;
    do {
      local_38 = local_60[sVar7];
      if (local_38 == (byte *)0x0) {
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                      ,0x26,"unsigned char get_char(unsigned char *, size_t)");
      }
      bVar2 = *local_38;
      p_Var8 = (_func_void_uchar_ptr_ptr_int_int *)(ulong)bVar2;
      uVar9 = (ulong)(bVar2 >> 6);
      depth = 1;
      uVar3 = (local_58->is_trie).super__Base_bitset<4UL>._M_w[uVar9] >> ((ulong)p_Var8 & 0x3f);
      pTVar4 = local_58;
      while ((uVar3 & 1) != 0) {
        if ((char)p_Var8 == '\0') {
          __assert_fail("not is_end(c)",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort.cpp"
                        ,0xdf,
                        "void insert(TrieNode<CharT> *, unsigned char **, size_t) [Threshold = 16000U, BucketT = vector_block<unsigned char *>, BurstImpl = BurstSimple<unsigned char>, CharT = unsigned char]"
                       );
        }
        pTVar4 = (TrieNode<unsigned_char> *)(pTVar4->buckets)._M_elems[(long)p_Var8];
        bVar2 = local_38[depth];
        p_Var8 = (_func_void_uchar_ptr_ptr_int_int *)(ulong)bVar2;
        uVar9 = (ulong)(bVar2 >> 6);
        depth = depth + 1;
        uVar3 = (pTVar4->is_trie).super__Base_bitset<4UL>._M_w[uVar9] >> ((ulong)p_Var8 & 0x3f);
      }
      pvVar5 = (vector_block<unsigned_char_*,_1024U> *)(pTVar4->buckets)._M_elems[(long)p_Var8];
      in_RCX = p_Var8;
      local_40 = sVar7;
      if (pvVar5 == (vector_block<unsigned_char_*,_1024U> *)0x0) {
        pvVar5 = (vector_block<unsigned_char_*,_1024U> *)operator_new(0x28);
        (pvVar5->_index_block).
        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (pvVar5->_index_block).
        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (pvVar5->_index_block).
        super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pvVar5->_insertpos = (uchar **)0x0;
        pvVar5->_left_in_block = 0;
        (pTVar4->buckets)._M_elems[(long)p_Var8] = pvVar5;
      }
      local_48 = pvVar5;
      vector_block<unsigned_char_*,_1024U>::push_back(pvVar5,&local_38);
      pvVar5 = local_48;
      if ((bVar2 != 0) &&
         (in_RCX = (_func_void_uchar_ptr_ptr_int_int *)(ulong)local_48->_left_in_block,
         16000 < (ulong)(((long)(local_48->_index_block).
                                super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(local_48->_index_block).
                               super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                               ._M_impl.super__Vector_impl_data._M_start) * 0x80 - (long)in_RCX))) {
        pTVar6 = BurstSimple<unsigned_char>::operator()(&local_61,local_48,depth);
        (pTVar4->buckets)._M_elems[(long)p_Var8] = pTVar6;
        p_Var1 = (pTVar4->is_trie).super__Base_bitset<4UL>._M_w + uVar9;
        *p_Var1 = *p_Var1 | 1L << (bVar2 & 0x3f);
        vector_block<unsigned_char_*,_1024U>::~vector_block(pvVar5);
        operator_delete(pvVar5);
      }
      sVar7 = local_40 + 1;
      pTVar4 = local_58;
    } while (sVar7 != local_50);
  }
  traverse<vector_block<unsigned_char*,1024u>,void(*)(unsigned_char**,int,int),unsigned_char>
            (pTVar4,local_60,0,in_RCX);
  return;
}

Assistant:

void burstsort_vector_block(unsigned char** strings, size_t n)
{
	typedef unsigned char CharT;
	typedef vector_block<unsigned char*> BucketT;
	typedef BurstSimple<CharT> BurstImpl;
	//typedef BurstRecursive<CharT> BurstImpl;
	TrieNode<CharT>* root = new TrieNode<CharT>;
	insert<16000, BucketT, BurstImpl>(root, strings, n);
	traverse<BucketT>(root, strings, 0, SmallSort);
}